

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateSnapshot.cxx
# Opt level: O1

cmValue __thiscall cmStateSnapshot::GetDefinition(cmStateSnapshot *this,string *name)

{
  cmLinkedTree<cmDefinitions> *pcVar1;
  StackIter begin;
  StackIter end;
  PointerType pSVar2;
  cmValue cVar3;
  PositionType *this_00;
  
  this_00 = &this->Position;
  pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar1 = (pSVar2->Vars).Tree;
  if ((pcVar1 != (cmLinkedTree<cmDefinitions> *)0x0) &&
     ((pSVar2->Vars).Position <=
      (ulong)(((long)(pcVar1->Data).
                     super__Vector_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pcVar1->Data).
                     super__Vector_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7))) {
    pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
    begin.Tree = (pSVar2->Vars).Tree;
    begin.Position = (pSVar2->Vars).Position;
    pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
    end.Tree = (pSVar2->Root).Tree;
    end.Position = (pSVar2->Root).Position;
    cVar3 = cmDefinitions::Get(name,begin,end);
    return (cmValue)cVar3.Value;
  }
  __assert_fail("this->Position->Vars.IsValid()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmStateSnapshot.cxx"
                ,0xd2,"cmValue cmStateSnapshot::GetDefinition(const std::string &) const");
}

Assistant:

cmValue cmStateSnapshot::GetDefinition(std::string const& name) const
{
  assert(this->Position->Vars.IsValid());
  return cmDefinitions::Get(name, this->Position->Vars, this->Position->Root);
}